

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void pnga_step_bound_info
               (Integer g_xx,Integer g_vv,Integer g_xxll,Integer g_xxuu,void *boundmin,
               void *wolfemin,void *boundmax)

{
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  Integer IVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Integer xxndim;
  void *local_280;
  void *local_278;
  Integer local_270;
  Integer local_268;
  Integer xxuundim;
  Integer xxllndim;
  Integer vvndim;
  Integer xxuutype;
  Integer xxlltype;
  Integer vvtype;
  Integer xxtype;
  Integer xxuulo [7];
  Integer xxllhi [7];
  Integer xxlllo [7];
  Integer vvhi [7];
  Integer vvlo [7];
  Integer xxhi [7];
  Integer xxlo [7];
  Integer xxuuhi [7];
  
  local_280 = wolfemin;
  local_278 = boundmin;
  pnga_inquire(g_xx,&xxtype,&xxndim,xxhi);
  pnga_inquire(g_vv,&vvtype,&vvndim,vvhi);
  local_268 = g_xxll;
  pnga_inquire(g_xxll,&xxlltype,&xxllndim,xxllhi);
  local_270 = g_xxuu;
  pnga_inquire(g_xxuu,&xxuutype,&xxuundim,xxuuhi);
  IVar4 = vvndim;
  IVar3 = xxllndim;
  IVar2 = xxuundim;
  IVar1 = xxndim;
  lVar7 = xxuundim + -1;
  lVar6 = xxllndim + -1;
  lVar5 = vvndim + -1;
  for (lVar8 = 0; IVar1 + lVar8 != 0; lVar8 = lVar8 + -1) {
    xxndim = IVar1 + lVar8 + -1;
    xxlo[IVar1 + lVar8 + -1] = 1;
    vvndim = lVar5 + lVar8;
    vvlo[IVar4 + lVar8 + -1] = 1;
    xxllndim = lVar6 + lVar8;
    xxlllo[IVar3 + lVar8 + -1] = 1;
    xxuundim = lVar7 + lVar8;
    xxuulo[IVar2 + lVar8 + -1] = 1;
  }
  pnga_step_bound_info_patch
            (g_xx,xxlo,xxhi,g_vv,vvlo,vvhi,local_268,xxlllo,xxllhi,local_270,xxuulo,xxuuhi,local_278
             ,local_280,boundmax);
  return;
}

Assistant:

void pnga_step_bound_info(Integer g_xx, Integer g_vv, Integer g_xxll,
                          Integer g_xxuu,  void *boundmin, void *wolfemin,
                          void *boundmax)
{
  Integer xxtype, xxndim;
  Integer vvtype, vvndim;
  Integer xxlltype, xxllndim;
  Integer xxuutype, xxuundim;
  Integer xxlo[MAXDIM],xxhi[MAXDIM];
  Integer vvlo[MAXDIM],vvhi[MAXDIM];
  Integer xxlllo[MAXDIM],xxllhi[MAXDIM];
  Integer xxuulo[MAXDIM],xxuuhi[MAXDIM];

  pnga_inquire(g_xx,  &xxtype, &xxndim, xxhi);
  pnga_inquire(g_vv,  &vvtype, &vvndim, vvhi);
  pnga_inquire(g_xxll,  &xxlltype, &xxllndim, xxllhi);
  pnga_inquire(g_xxuu,  &xxuutype, &xxuundim, xxuuhi);
  while(xxndim){
    xxlo[xxndim-1]=1;
    xxndim--;
    vvlo[vvndim-1]=1;
    vvndim--;
    xxlllo[xxllndim-1]=1;
    xxllndim--;
    xxuulo[xxuundim-1]=1;
    xxuundim--;
  }

  pnga_step_bound_info_patch(g_xx,xxlo,xxhi, g_vv,vvlo,vvhi, g_xxll,xxlllo,xxllhi, g_xxuu,xxuulo,xxuuhi, boundmin, wolfemin, boundmax);
}